

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void YUY2ToARGBRow_AVX2(uint8_t *yuy2_buf,uint8_t *dst_argb,YuvConstants *yuvconstants,int width)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_argb_local;
  uint8_t *yuy2_buf_local;
  
  auVar1 = *(undefined1 (*) [32])yuvconstants->kUVToB;
  auVar2 = *(undefined1 (*) [32])yuvconstants->kUVToG;
  auVar3 = *(undefined1 (*) [32])yuvconstants->kUVToR;
  auVar4 = *(undefined1 (*) [32])yuvconstants->kUVBiasB;
  auVar5 = *(undefined1 (*) [32])yuvconstants->kUVBiasG;
  auVar6 = *(undefined1 (*) [32])yuvconstants->kUVBiasR;
  auVar7 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  auVar9 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  do {
    auVar10 = vpshufb_avx2(*(undefined1 (*) [32])yuy2_buf,(undefined1  [32])libyuv::kShuffleYUY2Y);
    auVar15 = vpshufb_avx2(*(undefined1 (*) [32])yuy2_buf,(undefined1  [32])libyuv::kShuffleYUY2UV);
    yuy2_buf = (uint8_t *)((long)yuy2_buf + 0x20);
    auVar13 = vpmaddubsw_avx2(auVar15,auVar3);
    auVar14 = vpmaddubsw_avx2(auVar15,auVar2);
    auVar15 = vpmaddubsw_avx2(auVar15,auVar1);
    auVar11 = vpsubw_avx2(auVar6,auVar13);
    auVar14 = vpsubw_avx2(auVar5,auVar14);
    auVar13 = vpsubw_avx2(auVar4,auVar15);
    auVar15 = vpmulhuw_avx2(auVar7,auVar10);
    auVar13 = vpaddsw_avx2(auVar13,auVar15);
    auVar14 = vpaddsw_avx2(auVar14,auVar15);
    auVar15 = vpaddsw_avx2(auVar11,auVar15);
    auVar13 = vpsraw_avx2(auVar13,6);
    auVar14 = vpsraw_avx2(auVar14,6);
    auVar15 = vpsraw_avx2(auVar15,6);
    auVar13 = vpackuswb_avx2(auVar13,auVar13);
    auVar14 = vpackuswb_avx2(auVar14,auVar14);
    auVar15 = vpackuswb_avx2(auVar15,auVar15);
    auVar13 = vpunpcklbw_avx2(auVar13,auVar14);
    auVar10 = vpermq_avx2(auVar13,0xd8);
    auVar13 = vpunpcklbw_avx2(auVar15,auVar9);
    auVar13 = vpermq_avx2(auVar13,0xd8);
    auVar14 = vpunpcklwd_avx2(auVar10,auVar13);
    auVar13 = vpunpckhwd_avx2(auVar10,auVar13);
    *(undefined1 (*) [32])dst_argb = auVar14;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar13;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar12 = width + -0x10;
    bVar8 = 0xf < width;
    width = iVar12;
  } while (iVar12 != 0 && bVar8);
  return;
}

Assistant:

void OMITFP YUY2ToARGBRow_AVX2(const uint8_t* yuy2_buf,
                               uint8_t* dst_argb,
                               const struct YuvConstants* yuvconstants,
                               int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP_AVX2(yuvconstants)
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"

    LABELALIGN
      "1:                                        \n"
    READYUY2_AVX2
    YUVTORGB_AVX2(yuvconstants)
    STOREARGB_AVX2
      "sub         $0x10,%[width]                \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : [yuy2_buf]"+r"(yuy2_buf),    // %[yuy2_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants), // %[yuvconstants]
    [kShuffleYUY2Y]"m"(kShuffleYUY2Y),
    [kShuffleYUY2UV]"m"(kShuffleYUY2UV)
    : "memory", "cc", YUVTORGB_REGS_AVX2
      "xmm0", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}